

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseUnaryExpression(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  OperatorChar OVar3;
  UnaryOperators *this_00;
  size_type sVar4;
  UnaryOperatorExpression *this_01;
  Parser *in_RSI;
  OperatorChar local_b4;
  unique_ptr<Expression,_std::default_delete<Expression>_> local_b0;
  undefined2 local_a4;
  char local_a2;
  unique_ptr<UnaryOperatorExpression,_std::default_delete<UnaryOperatorExpression>_> local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_28 [8];
  unique_ptr<Expression,_std::default_delete<Expression>_> operand;
  OperatorChar op;
  Parser *this_local;
  
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == OPERATOR) {
    OVar3 = anon_unknown.dwarf_6ba02::tokenAsOperator(&in_RSI->mCurrentToken);
    operand._M_t.super___uniq_ptr_impl<Expression,_std::default_delete<Expression>_>._M_t.
    super__Tuple_impl<0UL,_Expression_*,_std::default_delete<Expression>_>.
    super__Head_base<0UL,_Expression_*,_false>._M_head_impl._5_2_ = OVar3._0_2_;
    operand._M_t.super___uniq_ptr_impl<Expression,_std::default_delete<Expression>_>._M_t.
    super__Tuple_impl<0UL,_Expression_*,_std::default_delete<Expression>_>.
    super__Head_base<0UL,_Expression_*,_false>._M_head_impl._7_1_ = OVar3.mOp2;
    nextToken(in_RSI);
    parseUnaryExpression((Parser *)local_28);
    bVar2 = std::operator!=((unique_ptr<Expression,_std::default_delete<Expression>_> *)local_28,
                            (nullptr_t)0x0);
    if (bVar2) {
      this_00 = CalculationEngine::unaryOperators(in_RSI->mCalcEngine);
      sVar4 = std::
              unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
              ::count(this_00,(key_type *)
                              ((long)&operand._M_t.
                                      super___uniq_ptr_impl<Expression,_std::default_delete<Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Expression_*,_std::default_delete<Expression>_>
                                      .super__Head_base<0UL,_Expression_*,_false>._M_head_impl + 5))
      ;
      if (sVar4 == 0) {
        OperatorChar::toString_abi_cxx11_
                  (&local_98,
                   (OperatorChar *)
                   ((long)&operand._M_t.
                           super___uniq_ptr_impl<Expression,_std::default_delete<Expression>_>._M_t.
                           super__Tuple_impl<0UL,_Expression_*,_std::default_delete<Expression>_>.
                           super__Head_base<0UL,_Expression_*,_false>._M_head_impl + 5));
        std::operator+(&local_78,"\'",&local_98);
        std::operator+(&local_58,&local_78,"\' is not a defined unary operator.");
        parseError(in_RSI,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      this_01 = (UnaryOperatorExpression *)operator_new(0x18);
      local_a2 = operand._M_t.super___uniq_ptr_impl<Expression,_std::default_delete<Expression>_>.
                 _M_t.super__Tuple_impl<0UL,_Expression_*,_std::default_delete<Expression>_>.
                 super__Head_base<0UL,_Expression_*,_false>._M_head_impl._7_1_;
      local_a4 = operand._M_t.super___uniq_ptr_impl<Expression,_std::default_delete<Expression>_>.
                 _M_t.super__Tuple_impl<0UL,_Expression_*,_std::default_delete<Expression>_>.
                 super__Head_base<0UL,_Expression_*,_false>._M_head_impl._5_2_;
      std::unique_ptr<Expression,_std::default_delete<Expression>_>::unique_ptr
                (&local_b0,(unique_ptr<Expression,_std::default_delete<Expression>_> *)local_28);
      local_b4.mOp2 = local_a2;
      local_b4.mIsTwoChars = (bool)(undefined1)local_a4;
      local_b4.mOp1 = local_a4._1_1_;
      UnaryOperatorExpression::UnaryOperatorExpression(this_01,local_b4,&local_b0);
      std::unique_ptr<UnaryOperatorExpression,std::default_delete<UnaryOperatorExpression>>::
      unique_ptr<std::default_delete<UnaryOperatorExpression>,void>
                ((unique_ptr<UnaryOperatorExpression,std::default_delete<UnaryOperatorExpression>> *
                 )&local_a0,this_01);
      std::unique_ptr<Expression,std::default_delete<Expression>>::
      unique_ptr<UnaryOperatorExpression,std::default_delete<UnaryOperatorExpression>,void>
                ((unique_ptr<Expression,std::default_delete<Expression>> *)this,&local_a0);
      std::unique_ptr<UnaryOperatorExpression,_std::default_delete<UnaryOperatorExpression>_>::
      ~unique_ptr(&local_a0);
      std::unique_ptr<Expression,_std::default_delete<Expression>_>::~unique_ptr(&local_b0);
    }
    else {
      std::unique_ptr<Expression,_std::default_delete<Expression>_>::unique_ptr
                ((unique_ptr<Expression,_std::default_delete<Expression>_> *)this,
                 (unique_ptr<Expression,_std::default_delete<Expression>_> *)local_28);
    }
    std::unique_ptr<Expression,_std::default_delete<Expression>_>::~unique_ptr
              ((unique_ptr<Expression,_std::default_delete<Expression>_> *)local_28);
  }
  else {
    parsePrimaryExpression(this);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseUnaryExpression() {
	//If the current token isn't an operator, is must be a primary expression
	if (mCurrentToken.type() != TokenType::OPERATOR) {
		return parsePrimaryExpression();
	}

	//If this is a unary operator, read it.
	auto op = tokenAsOperator(mCurrentToken);
	nextToken(); //Eat the operator

	auto operand = parseUnaryExpression();

	if (operand != nullptr) {
		if (mCalcEngine.unaryOperators().count(op) == 0) {
			parseError("'" + op.toString() + "' is not a defined unary operator.");
		}

		return std::unique_ptr<UnaryOperatorExpression>(
			new UnaryOperatorExpression(op, std::move(operand)));
	}

	return operand;
}